

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senary_executor.hpp
# Opt level: O0

void duckdb::SenaryExecutor::
     Execute<long,long,long,long,long,double,duckdb::timestamp_t,duckdb::timestamp_t(*)(long,long,long,long,long,double)>
               (DataChunk *input,Vector *result,
               _func_timestamp_t_long_long_long_long_long_double *fun)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  UnifiedVectorFormat *pUVar12;
  code *pcVar13;
  bool bVar14;
  VectorType VVar15;
  bool bVar16;
  reference this;
  long *plVar17;
  long *plVar18;
  long *plVar19;
  long *plVar20;
  long *plVar21;
  double *pdVar22;
  timestamp_t *ptVar23;
  int64_t iVar24;
  reference pvVar25;
  reference pvVar26;
  idx_t iVar27;
  reference pvVar28;
  code *in_RDX;
  Vector *in_RSI;
  DataChunk *in_RDI;
  size_t c_2;
  idx_t r_1;
  size_t c_1;
  idx_t r;
  vector<unsigned_long,_true> idx;
  double *fdata_1;
  long *edata_1;
  long *ddata_1;
  long *cdata_1;
  long *bdata_1;
  long *adata_1;
  size_t c;
  vector<duckdb::UnifiedVectorFormat,_true> vdata;
  bool all_valid;
  ValidityMask *result_validity;
  timestamp_t *result_data_1;
  timestamp_t *result_data;
  double *fdata;
  long *edata;
  long *ddata;
  long *cdata;
  long *bdata;
  long *adata;
  Vector *v;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::Vector,_true> *__range2;
  bool any_null;
  bool all_constant;
  idx_t count;
  vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *in_stack_fffffffffffffcb8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffcc0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffcc8;
  bool local_179;
  ulong local_150;
  UnifiedVectorFormat *local_148;
  ulong local_138;
  UnifiedVectorFormat *local_130;
  ulong local_d8;
  bool local_99;
  __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
  local_38;
  DataChunk *local_30;
  byte local_22;
  byte local_21;
  UnifiedVectorFormat *local_20;
  code *local_18;
  Vector *local_10;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (UnifiedVectorFormat *)DataChunk::size(in_RDI);
  local_21 = 1;
  local_22 = 0;
  local_30 = local_8;
  local_38._M_current =
       (Vector *)
       std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::begin
                 (in_stack_fffffffffffffcb8);
  std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::end(in_stack_fffffffffffffcb8);
  do {
    bVar14 = __gnu_cxx::operator!=
                       ((__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                         *)in_stack_fffffffffffffcc0,
                        (__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                         *)in_stack_fffffffffffffcb8);
    if (!bVar14) {
LAB_00d27a87:
      if ((local_21 & 1) == 0) {
        duckdb::Vector::SetVectorType((VectorType)local_10);
        ptVar23 = FlatVector::GetData<duckdb::timestamp_t>((Vector *)0xd27c32);
        FlatVector::Validity((Vector *)0xd27c47);
        local_99 = true;
        std::allocator<duckdb::UnifiedVectorFormat>::allocator
                  ((allocator<duckdb::UnifiedVectorFormat> *)0xd27c6c);
        vector<duckdb::UnifiedVectorFormat,_true>::vector
                  ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                   (size_type)in_stack_fffffffffffffcb8,(allocator_type *)0xd27c86);
        std::allocator<duckdb::UnifiedVectorFormat>::~allocator
                  ((allocator<duckdb::UnifiedVectorFormat> *)0xd27c95);
        for (local_d8 = 0; local_d8 < 6; local_d8 = local_d8 + 1) {
          pvVar25 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                               (size_type)in_stack_fffffffffffffcb8);
          pUVar12 = local_20;
          vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                    ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          duckdb::Vector::ToUnifiedFormat((ulong)pvVar25,pUVar12);
          local_179 = false;
          if (local_99 != false) {
            pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)
                                 in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
            local_179 = TemplatedValidityMask<unsigned_long>::AllValid
                                  ((TemplatedValidityMask<unsigned_long> *)(pvVar26 + 0x10));
          }
          local_99 = local_179;
        }
        pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                             (size_type)in_stack_fffffffffffffcb8);
        lVar1 = *(long *)(pvVar26 + 8);
        pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                             (size_type)in_stack_fffffffffffffcb8);
        lVar2 = *(long *)(pvVar26 + 8);
        pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                             (size_type)in_stack_fffffffffffffcb8);
        lVar3 = *(long *)(pvVar26 + 8);
        pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                             (size_type)in_stack_fffffffffffffcb8);
        lVar4 = *(long *)(pvVar26 + 8);
        pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                             (size_type)in_stack_fffffffffffffcb8);
        lVar5 = *(long *)(pvVar26 + 8);
        pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                             (size_type)in_stack_fffffffffffffcb8);
        lVar6 = *(long *)(pvVar26 + 8);
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xd27f03);
        vector<unsigned_long,_true>::vector
                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                   (size_type)in_stack_fffffffffffffcb8,(allocator_type *)0xd27f1d);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xd27f2c);
        if (local_99 == false) {
          for (local_148 = (UnifiedVectorFormat *)0x0; local_148 < local_20;
              local_148 = local_148 + 1) {
            bVar14 = true;
            for (local_150 = 0; local_150 < 6; local_150 = local_150 + 1) {
              pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                  ((vector<duckdb::UnifiedVectorFormat,_true> *)
                                   in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
              iVar27 = SelectionVector::get_index(*(SelectionVector **)pvVar26,(idx_t)local_148);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              *pvVar28 = iVar27;
              vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)in_stack_fffffffffffffcc0,
                         (size_type)in_stack_fffffffffffffcb8);
              vector<unsigned_long,_true>::operator[]
                        ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                         (size_type)in_stack_fffffffffffffcb8);
              bVar16 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (in_stack_fffffffffffffcc8,(idx_t)in_stack_fffffffffffffcc0);
              if (!bVar16) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (in_stack_fffffffffffffcc0,(idx_t)in_stack_fffffffffffffcb8);
                bVar14 = false;
                break;
              }
            }
            pcVar13 = local_18;
            if (bVar14) {
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              uVar7 = *(undefined8 *)(lVar1 + *pvVar28 * 8);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              uVar8 = *(undefined8 *)(lVar2 + *pvVar28 * 8);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              uVar9 = *(undefined8 *)(lVar3 + *pvVar28 * 8);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              uVar10 = *(undefined8 *)(lVar4 + *pvVar28 * 8);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              in_stack_fffffffffffffcc8 =
                   *(TemplatedValidityMask<unsigned_long> **)(lVar5 + *pvVar28 * 8);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              in_stack_fffffffffffffcc0 =
                   (TemplatedValidityMask<unsigned_long> *)
                   (*pcVar13)(*(undefined8 *)(lVar6 + *pvVar28 * 8),uVar7,uVar8,uVar9,uVar10,
                              in_stack_fffffffffffffcc8);
              ptVar23[(long)local_148].value = (int64_t)in_stack_fffffffffffffcc0;
            }
          }
        }
        else {
          for (local_130 = (UnifiedVectorFormat *)0x0; local_130 < local_20;
              local_130 = local_130 + 1) {
            for (local_138 = 0; pcVar13 = local_18, local_138 < 6; local_138 = local_138 + 1) {
              pvVar26 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                  ((vector<duckdb::UnifiedVectorFormat,_true> *)
                                   in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
              iVar27 = SelectionVector::get_index(*(SelectionVector **)pvVar26,(idx_t)local_130);
              pvVar28 = vector<unsigned_long,_true>::operator[]
                                  ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                   (size_type)in_stack_fffffffffffffcb8);
              *pvVar28 = iVar27;
            }
            pvVar28 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                 (size_type)in_stack_fffffffffffffcb8);
            uVar7 = *(undefined8 *)(lVar1 + *pvVar28 * 8);
            pvVar28 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                 (size_type)in_stack_fffffffffffffcb8);
            uVar8 = *(undefined8 *)(lVar2 + *pvVar28 * 8);
            pvVar28 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                 (size_type)in_stack_fffffffffffffcb8);
            uVar9 = *(undefined8 *)(lVar3 + *pvVar28 * 8);
            pvVar28 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                 (size_type)in_stack_fffffffffffffcb8);
            uVar10 = *(undefined8 *)(lVar4 + *pvVar28 * 8);
            pvVar28 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                 (size_type)in_stack_fffffffffffffcb8);
            uVar11 = *(undefined8 *)(lVar5 + *pvVar28 * 8);
            pvVar28 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcc0,
                                 (size_type)in_stack_fffffffffffffcb8);
            iVar24 = (*pcVar13)(*(undefined8 *)(lVar6 + *pvVar28 * 8),uVar7,uVar8,uVar9,uVar10,
                                uVar11);
            ptVar23[(long)local_130].value = iVar24;
          }
        }
        vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xd28621);
        vector<duckdb::UnifiedVectorFormat,_true>::~vector
                  ((vector<duckdb::UnifiedVectorFormat,_true> *)0xd2862e);
      }
      else {
        duckdb::Vector::SetVectorType((VectorType)local_10);
        if ((local_22 & 1) == 0) {
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          plVar17 = ConstantVector::GetData<long>((Vector *)0xd27ae1);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          plVar18 = ConstantVector::GetData<long>((Vector *)0xd27b03);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          plVar19 = ConstantVector::GetData<long>((Vector *)0xd27b25);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          plVar20 = ConstantVector::GetData<long>((Vector *)0xd27b47);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          plVar21 = ConstantVector::GetData<long>((Vector *)0xd27b69);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffcc0,
                     (size_type)in_stack_fffffffffffffcb8);
          pdVar22 = ConstantVector::GetData<double>((Vector *)0xd27b8b);
          ptVar23 = ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0xd27ba0);
          iVar24 = (*local_18)(*pdVar22,*plVar17,*plVar18,*plVar19,*plVar20,*plVar21);
          ptVar23->value = iVar24;
        }
        else {
          duckdb::ConstantVector::SetNull(local_10,true);
        }
      }
      return;
    }
    this = __gnu_cxx::
           __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
           ::operator*(&local_38);
    VVar15 = Vector::GetVectorType(this);
    if (VVar15 != CONSTANT_VECTOR) {
      local_21 = 0;
      goto LAB_00d27a87;
    }
    bVar14 = ConstantVector::IsNull((Vector *)0xd27a5c);
    if (bVar14) {
      local_22 = 1;
    }
    __gnu_cxx::
    __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

static void Execute(DataChunk &input, Vector &result, FUN fun) {
		D_ASSERT(input.ColumnCount() >= NCOLS);
		const auto count = input.size();

		bool all_constant = true;
		bool any_null = false;
		for (const auto &v : input.data) {
			if (v.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				if (ConstantVector::IsNull(v)) {
					any_null = true;
				}
			} else {
				all_constant = false;
				break;
			}
		}

		if (all_constant) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (any_null) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<TA>(input.data[0]);
				auto bdata = ConstantVector::GetData<TB>(input.data[1]);
				auto cdata = ConstantVector::GetData<TC>(input.data[2]);
				auto ddata = ConstantVector::GetData<TD>(input.data[3]);
				auto edata = ConstantVector::GetData<TE>(input.data[4]);
				auto fdata = ConstantVector::GetData<TF>(input.data[5]);
				auto result_data = ConstantVector::GetData<TR>(result);
				result_data[0] = fun(*adata, *bdata, *cdata, *ddata, *edata, *fdata);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<TR>(result);
			auto &result_validity = FlatVector::Validity(result);

			bool all_valid = true;
			vector<UnifiedVectorFormat> vdata(NCOLS);
			for (size_t c = 0; c < NCOLS; ++c) {
				input.data[c].ToUnifiedFormat(count, vdata[c]);
				all_valid = all_valid && vdata[c].validity.AllValid();
			}

			auto adata = (const TA *)(vdata[0].data);
			auto bdata = (const TB *)(vdata[1].data);
			auto cdata = (const TC *)(vdata[2].data);
			auto ddata = (const TD *)(vdata[3].data);
			auto edata = (const TE *)(vdata[4].data);
			auto fdata = (const TF *)(vdata[5].data);

			vector<idx_t> idx(NCOLS);
			if (all_valid) {
				for (idx_t r = 0; r < count; ++r) {
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
					}
					result_data[r] =
					    fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]], fdata[idx[5]]);
				}
			} else {
				for (idx_t r = 0; r < count; ++r) {
					all_valid = true;
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
						if (!vdata[c].validity.RowIsValid(idx[c])) {
							result_validity.SetInvalid(r);
							all_valid = false;
							break;
						}
					}
					if (all_valid) {
						result_data[r] = fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]],
						                     fdata[idx[5]]);
					}
				}
			}
		}
	}